

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void HeavyChange_Test_Hitter<8u>(string *PATH)

{
  size_type *psVar1;
  size_type *psVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  code *pcVar7;
  Abstract<8U> *this;
  LDSketch_t *pLVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  char cVar11;
  pointer ppbVar12;
  undefined1 auVar13 [64];
  uint num;
  int iVar14;
  int iVar15;
  void *pvVar16;
  long *plVar17;
  FR<8U> *pFVar18;
  FR_CF<8U> *pFVar19;
  WavingSketch<8U,_1U,_8U> *pWVar20;
  WavingSketch<8U,_16U,_8U> *pWVar21;
  LdSketchWrapper<8U> *pLVar22;
  ostream *poVar23;
  Data<8U> *__ptr;
  iterator iVar24;
  mapped_type *pmVar25;
  undefined1 (*pauVar26) [16];
  __hashtable_alloc *p_Var27;
  uint32_t j;
  long lVar28;
  undefined1 auVar29 [8];
  ulong uVar30;
  undefined1 *puVar31;
  uint uVar32;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  undefined8 *puVar33;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auStack_358 [8];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<8U>,_int>,_true>_>_>
  local_350;
  ofstream out;
  long local_340;
  long lStack_338;
  ios_base local_258 [264];
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_150;
  undefined1 *local_118;
  string *local_110;
  __hashtable_alloc *local_108;
  undefined8 local_100;
  LdSketchWrapper<8U> *local_f8;
  size_type *local_f0;
  string file;
  int record_count;
  undefined1 auStack_b8 [8];
  HashMap<8U> mp;
  undefined1 auStack_78 [8];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  key_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 auVar36 [16];
  
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)mp._M_h._M_bucket_count;
  puVar31 = auStack_358;
  _auStack_78 = (undefined1  [16])0x0;
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = PATH;
  auStack_78 = (undefined1  [8])operator_new(0x18);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(*(undefined1 (*) [16])((long)auStack_78 + 0x10) + 8);
  *(undefined1 (*) [16])auStack_78 = (undefined1  [16])0x0;
  *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x10) = 0;
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       outs.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = &file._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"caida","");
  pvVar16 = operator_new(0x200);
  psVar1 = &__str._M_string_length;
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
  psVar2 = &mp._M_h._M_bucket_count;
  pauVar26 = (undefined1 (*) [16])(plVar17 + 2);
  if ((undefined1 (*) [16])*plVar17 == pauVar26) {
    mp._M_h._8_16_ = *pauVar26;
    auStack_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *(size_type *)*pauVar26;
    auStack_b8 = (undefined1  [8])*plVar17;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar17[1];
  *plVar17 = (long)pauVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append(auStack_b8);
  p_Var27 = (__hashtable_alloc *)(plVar17 + 2);
  if ((__hashtable_alloc *)*plVar17 == p_Var27) {
    local_340 = *(long *)p_Var27;
    lStack_338 = plVar17[3];
    local_350._M_h = (__hashtable_alloc *)&local_340;
  }
  else {
    local_340 = *(long *)p_Var27;
    local_350._M_h = (__hashtable_alloc *)*plVar17;
  }
  _out = plVar17[1];
  *plVar17 = (long)p_Var27;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::ofstream::ofstream(pvVar16,(string *)&local_350,_S_out);
  *(void **)auStack_78 = pvVar16;
  if (local_350._M_h != (__hashtable_alloc *)&local_340) {
    operator_delete(local_350._M_h,local_340 + 1);
  }
  if (auStack_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  pvVar16 = operator_new(0x200);
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
  pauVar26 = (undefined1 (*) [16])(plVar17 + 2);
  if ((undefined1 (*) [16])*plVar17 == pauVar26) {
    mp._M_h._8_16_ = *pauVar26;
    auStack_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *(size_type *)*pauVar26;
    auStack_b8 = (undefined1  [8])*plVar17;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar17[1];
  *plVar17 = (long)pauVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append(auStack_b8);
  p_Var27 = (__hashtable_alloc *)(plVar17 + 2);
  if ((__hashtable_alloc *)*plVar17 == p_Var27) {
    local_340 = *(long *)p_Var27;
    lStack_338 = plVar17[3];
    local_350._M_h = (__hashtable_alloc *)&local_340;
  }
  else {
    local_340 = *(long *)p_Var27;
    local_350._M_h = (__hashtable_alloc *)*plVar17;
  }
  _out = plVar17[1];
  *plVar17 = (long)p_Var27;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::ofstream::ofstream(pvVar16,(string *)&local_350,_S_out);
  *(void **)((long)auStack_78 + 8) = pvVar16;
  if (local_350._M_h != (__hashtable_alloc *)&local_340) {
    operator_delete(local_350._M_h,local_340 + 1);
  }
  if (auStack_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  pvVar16 = operator_new(0x200);
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
  pauVar26 = (undefined1 (*) [16])(plVar17 + 2);
  if ((undefined1 (*) [16])*plVar17 == pauVar26) {
    mp._M_h._8_16_ = *pauVar26;
    auStack_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *(size_type *)*pauVar26;
    auStack_b8 = (undefined1  [8])*plVar17;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar17[1];
  *plVar17 = (long)pauVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append(auStack_b8);
  p_Var27 = (__hashtable_alloc *)(plVar17 + 2);
  if ((__hashtable_alloc *)*plVar17 == p_Var27) {
    local_340 = *(long *)p_Var27;
    lStack_338 = plVar17[3];
    local_350._M_h = (__hashtable_alloc *)&local_340;
  }
  else {
    local_340 = *(long *)p_Var27;
    local_350._M_h = (__hashtable_alloc *)*plVar17;
  }
  _out = plVar17[1];
  *plVar17 = (long)p_Var27;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::ofstream::ofstream(pvVar16,(string *)&local_350,_S_out);
  *(void **)((long)auStack_78 + 0x10) = pvVar16;
  if (local_350._M_h != (__hashtable_alloc *)&local_340) {
    operator_delete(local_350._M_h,local_340 + 1);
  }
  if (auStack_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  local_108 = _VTT;
  local_100 = _log;
  iVar15 = 0;
  do {
    num = iVar15 * 500000 + 2000000;
    *(undefined8 *)(puVar31 + -8) = 0x107b14;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m");
    auStack_b8 = (undefined1  [8])&mp._M_h._M_rehash_policy._M_next_resize;
    mp._M_h._M_buckets = (__buckets_ptr)0x1;
    mp._M_h._M_bucket_count = 0;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mp._M_h._M_element_count = 0x3f800000;
    mp._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    mp._M_h._M_rehash_policy._4_4_ = 0;
    mp._M_h._M_rehash_policy._M_next_resize = 0;
    puVar33 = (undefined8 *)(puVar31 + -0x50);
    local_118 = puVar31;
    *(undefined8 *)(puVar31 + -0x58) = 0x107b75;
    pFVar18 = (FR<8U> *)operator_new(0x90);
    *(undefined8 *)(puVar31 + -0x58) = 0x107b89;
    FR<8U>::FR(pFVar18,num,0x6ce);
    *puVar33 = pFVar18;
    *(undefined8 *)(puVar31 + -0x58) = 0x107b97;
    pFVar19 = (FR_CF<8U> *)operator_new(0x98);
    *(undefined8 *)(puVar31 + -0x58) = 0x107bab;
    FR_CF<8U>::FR_CF(pFVar19,num,0x6ce);
    *(FR_CF<8U> **)(puVar31 + -0x48) = pFVar19;
    *(undefined8 *)(puVar31 + -0x58) = 0x107bb9;
    pWVar20 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar31 + -0x58) = 0x107be2;
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar20,num / 10,0x6ce,3);
    *(WavingSketch<8U,_1U,_8U> **)(puVar31 + -0x40) = pWVar20;
    *(undefined8 *)(puVar31 + -0x58) = 0x107bf0;
    pWVar21 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar31 + -0x58) = 0x107c08;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar21,num / 10,0x6ce,3);
    *(WavingSketch<8U,_16U,_8U> **)(puVar31 + -0x38) = pWVar21;
    *(undefined8 *)(puVar31 + -0x58) = 0x107c16;
    pLVar22 = (LdSketchWrapper<8U> *)operator_new(0x88);
    uVar32 = num / 10;
    local_f8 = pLVar22;
    *(undefined8 *)(puVar31 + -0x58) = 0x107c34;
    LdSketchWrapper<8U>::LdSketchWrapper(pLVar22,num / 10,0x6ce);
    *(LdSketchWrapper<8U> **)(puVar31 + -0x30) = pLVar22;
    *(undefined8 *)(puVar31 + -0x58) = 0x107c42;
    pFVar18 = (FR<8U> *)operator_new(0x90);
    *(undefined8 *)(puVar31 + -0x58) = 0x107c56;
    FR<8U>::FR(pFVar18,num,0x6ce);
    *(FR<8U> **)(puVar31 + -0x28) = pFVar18;
    *(undefined8 *)(puVar31 + -0x58) = 0x107c64;
    pFVar19 = (FR_CF<8U> *)operator_new(0x98);
    *(undefined8 *)(puVar31 + -0x58) = 0x107c78;
    FR_CF<8U>::FR_CF(pFVar19,num,0x6ce);
    *(FR_CF<8U> **)(puVar31 + -0x20) = pFVar19;
    *(undefined8 *)(puVar31 + -0x58) = 0x107c86;
    pWVar20 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar31 + -0x58) = 0x107c9e;
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar20,uVar32,0x6ce,3);
    *(WavingSketch<8U,_1U,_8U> **)(puVar31 + -0x18) = pWVar20;
    *(undefined8 *)(puVar31 + -0x58) = 0x107cac;
    pWVar21 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar31 + -0x58) = 0x107cc4;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar21,uVar32,0x6ce,3);
    *(WavingSketch<8U,_16U,_8U> **)(puVar31 + -0x10) = pWVar21;
    *(undefined8 *)(puVar31 + -0x58) = 0x107cd2;
    pLVar22 = (LdSketchWrapper<8U> *)operator_new(0x88);
    *(undefined8 *)(puVar31 + -0x58) = 0x107ce5;
    LdSketchWrapper<8U>::LdSketchWrapper(pLVar22,uVar32,0x6ce);
    *(LdSketchWrapper<8U> **)(puVar31 + -8) = pLVar22;
    if (iVar15 == 0) {
      ppbVar12 = outs.
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      for (auVar29 = auStack_78; auVar29 != (undefined1  [8])ppbVar12;
          auVar29 = (undefined1  [8])((long)auVar29 + 8)) {
        poVar23 = *(ostream **)auVar29;
        *(undefined8 *)(puVar31 + -0x58) = 0x107d22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,"MEM(KB)",7);
        *(undefined8 *)(puVar31 + -0x58) = 0x107d36;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,",",1);
        lVar28 = 0;
        do {
          poVar23 = *(ostream **)auVar29;
          pcVar3 = *(char **)(puVar33[lVar28] + 8);
          lVar4 = *(long *)(puVar33[lVar28] + 0x10);
          *(undefined8 *)(puVar31 + -0x58) = 0x107d4e;
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>(poVar23,pcVar3,lVar4);
          *(undefined8 *)(puVar31 + -0x58) = 0x107d62;
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,",",1);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
        uVar5 = *(undefined8 *)
                 (*(long *)*(basic_ostream<char,_std::char_traits<char>_> **)auVar29 + -0x18);
        cVar11 = (char)*(basic_ostream<char,_std::char_traits<char>_> **)auVar29;
        *(undefined8 *)(puVar31 + -0x58) = 0x107d83;
        std::ios::widen((char)uVar5 + cVar11);
        *(undefined8 *)(puVar31 + -0x58) = 0x107d8e;
        std::ostream::put(cVar11);
        *(undefined8 *)(puVar31 + -0x58) = 0x107d96;
        std::ostream::flush();
      }
    }
    ppbVar12 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (auVar29 = auStack_78; auVar29 != (undefined1  [8])ppbVar12;
        auVar29 = (undefined1  [8])((long)auVar29 + 8)) {
      poVar23 = *(ostream **)auVar29;
      *(undefined8 *)(puVar31 + -0x58) = 0x107dbf;
      poVar23 = (ostream *)std::ostream::operator<<(poVar23,num / 1000);
      *(undefined8 *)(puVar31 + -0x58) = 0x107dd3;
      std::__ostream_insert<char,std::char_traits<char>>(poVar23,",",1);
    }
    pcVar3 = (local_110->_M_dataplus)._M_p;
    *(undefined8 *)(puVar31 + -0x58) = 0x107df5;
    __ptr = read_standard_data<8u>(pcVar3,record_length,(int *)(file.field_2._M_local_buf + 0xc));
    local_50.str[0] = '\0';
    local_50.str[1] = '\0';
    local_50.str[2] = '\0';
    local_50.str[3] = '\0';
    local_50.str[4] = '\0';
    local_50.str[5] = '\0';
    local_50.str[6] = '\0';
    local_50.str[7] = '\0';
    uVar32 = (int)file.field_2._12_4_ / 2;
    if (9999999 < (int)file.field_2._12_4_ / 2) {
      uVar32 = 10000000;
    }
    uVar30 = 0;
    if (1 < (int)file.field_2._12_4_) {
      uVar34 = 1;
      if (1 < (int)uVar32) {
        uVar34 = (ulong)uVar32;
      }
      uVar30 = 0;
      do {
        local_50.str = *&__ptr[uVar30].str;
        *(undefined8 *)(puVar31 + -0x58) = 0x107e5b;
        iVar24 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)auStack_b8,&local_50);
        if (iVar24.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(puVar31 + -0x58) = 0x107e82;
          pmVar25 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_b8,&local_50);
          *pmVar25 = 1;
        }
        else {
          *(undefined8 *)(puVar31 + -0x58) = 0x107e6f;
          pmVar25 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_b8,&local_50);
          *pmVar25 = *pmVar25 + 1;
        }
        uVar30 = uVar30 + 1;
        lVar28 = 0;
        do {
          puVar6 = (undefined8 *)puVar33[lVar28];
          pcVar7 = *(code **)*puVar6;
          *(undefined8 *)(puVar31 + -0x58) = 0x107e9b;
          (*pcVar7)(puVar6,&local_50);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
      } while (uVar30 != uVar34);
    }
    if (SBORROW4((int)uVar30,uVar32 * 2) != (int)((int)uVar30 + uVar32 * -2) < 0) {
      uVar30 = uVar30 & 0xffffffff;
      do {
        local_50.str = *&__ptr[uVar30].str;
        *(undefined8 *)(puVar31 + -0x58) = 0x107ed8;
        iVar24 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)auStack_b8,&local_50);
        if (iVar24.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(puVar31 + -0x58) = 0x107eff;
          pmVar25 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_b8,&local_50);
          *pmVar25 = -1;
        }
        else {
          *(undefined8 *)(puVar31 + -0x58) = 0x107eec;
          pmVar25 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_b8,&local_50);
          *pmVar25 = *pmVar25 + -1;
        }
        uVar30 = uVar30 + 1;
        lVar28 = 0;
        do {
          puVar6 = *(undefined8 **)(puVar31 + lVar28 * 8 + -0x28);
          pcVar7 = *(code **)*puVar6;
          *(undefined8 *)(puVar31 + -0x58) = 0x107f18;
          (*pcVar7)(puVar6,&local_50);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
      } while (uVar30 != uVar32 * 2);
    }
    *(undefined8 *)(puVar31 + -0x58) = 0x107f32;
    free(__ptr);
    lVar28 = -5;
    do {
      plVar17 = *(long **)(puVar31 + lVar28 * 8 + -0x28);
      local_150._M_buckets = (__buckets_ptr)0x0;
      local_150._M_bucket_count = (size_type)mp._M_h._M_buckets;
      local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_150._M_element_count = (size_type)mp._M_h._M_before_begin._M_nxt;
      local_150._M_rehash_policy._0_8_ = mp._M_h._M_element_count;
      local_150._M_rehash_policy._M_next_resize = mp._M_h._M_rehash_policy._0_8_;
      local_150._M_single_bucket = (__node_base_ptr)0x0;
      local_350._M_h = (__hashtable_alloc *)&local_150;
      *(undefined8 *)(puVar31 + -0x58) = 0x107fa9;
      std::
      _Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<8u>const,int>,true>>>>
                ((_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_150,
                 (_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)auStack_b8,&local_350);
      uVar5 = *(undefined8 *)(puVar31 + lVar28 * 8);
      pcVar7 = *(code **)(*plVar17 + 0x20);
      *(undefined8 *)(puVar31 + -0x58) = 0x107fbe;
      (*pcVar7)(plVar17,&local_150,uVar5,auStack_78);
      *(undefined8 *)(puVar31 + -0x58) = 0x107fc6;
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_150);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0);
    *(undefined8 *)(puVar31 + -0x58) = 0x107fdb;
    std::ofstream::ofstream(&local_350);
    lVar28 = 0;
    do {
      *(undefined8 *)(puVar31 + -0x58) = 0x107ff2;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      this = (Abstract<8U> *)puVar33[lVar28];
      *(undefined8 *)(puVar31 + -0x58) = 0x108006;
      Abstract<8U>::print_f1(this,(ofstream *)&local_350,num);
      pLVar22 = local_f8;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 5);
    pLVar8 = local_f8->summary;
    iVar14 = pLVar8->w * pLVar8->h;
    if (0 < iVar14) {
      uVar30 = (ulong)(iVar14 + 3U & 0xfffffffc);
      auVar41 = vpbroadcastq_avx512vl();
      uVar34 = 0;
      auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar43 = auVar13;
        auVar42 = vpbroadcastq_avx512vl();
        auVar42 = vpor_avx2(auVar42,auVar10);
        uVar35 = vpcmpuq_avx512vl(auVar42,auVar41,2);
        uVar35 = uVar35 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(pLVar8->tbl + uVar34));
        auVar36 = vpgatherqd_avx512vl(*(undefined8 *)(uVar30 + 0x40));
        auVar37._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar36._4_4_;
        auVar37._0_4_ = (uint)((byte)uVar35 & 1) * auVar36._0_4_;
        auVar37._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar36._8_4_;
        auVar37._12_4_ = (uint)(byte)(uVar35 >> 3) * auVar36._12_4_;
        auVar36 = vpaddd_avx(auVar37,auVar43._0_16_);
        uVar34 = uVar34 + 4;
        auVar13 = ZEXT1664(auVar36);
      } while (uVar30 != uVar34);
      auVar36 = vmovdqa32_avx512vl(auVar36);
      bVar9 = (bool)((byte)uVar35 & 1);
      auVar38._0_4_ = (uint)bVar9 * auVar36._0_4_ | (uint)!bVar9 * auVar43._0_4_;
      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar9 * auVar36._4_4_ | (uint)!bVar9 * auVar43._4_4_;
      bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar9 * auVar36._8_4_ | (uint)!bVar9 * auVar43._8_4_;
      bVar9 = SUB81(uVar35 >> 3,0);
      auVar38._12_4_ = (uint)bVar9 * auVar36._12_4_ | (uint)!bVar9 * auVar43._12_4_;
      auVar36 = vphaddd_avx(auVar38,auVar38);
      auVar36 = vphaddd_avx(auVar36,auVar36);
      vcvtdq2pd_avx(auVar36);
    }
    *(undefined8 *)(puVar31 + -0x58) = 0x1080bd;
    printf("After average l first half: %lf\n");
    pLVar8 = pLVar22->summary;
    iVar14 = pLVar8->w * pLVar8->h;
    if (0 < iVar14) {
      uVar30 = (ulong)(iVar14 + 3U & 0xfffffffc);
      auVar41 = vpbroadcastq_avx512vl();
      uVar34 = 0;
      auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar36 = ZEXT816(0) << 0x40;
      do {
        auVar37 = auVar36;
        auVar42 = vpbroadcastq_avx512vl();
        auVar42 = vpor_avx2(auVar42,auVar10);
        uVar35 = vpcmpuq_avx512vl(auVar42,auVar41,2);
        uVar35 = uVar35 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(pLVar8->tbl + uVar34));
        auVar36 = vpgatherqd_avx512vl(*(undefined8 *)(uVar30 + 0x40));
        auVar39._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar36._4_4_;
        auVar39._0_4_ = (uint)((byte)uVar35 & 1) * auVar36._0_4_;
        auVar39._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar36._8_4_;
        auVar39._12_4_ = (uint)(byte)(uVar35 >> 3) * auVar36._12_4_;
        auVar36 = vpaddd_avx(auVar39,auVar37);
        uVar34 = uVar34 + 4;
      } while (uVar30 != uVar34);
      auVar36 = vmovdqa32_avx512vl(auVar36);
      bVar9 = (bool)((byte)uVar35 & 1);
      auVar40._0_4_ = (uint)bVar9 * auVar36._0_4_ | (uint)!bVar9 * auVar37._0_4_;
      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar9 * auVar36._4_4_ | (uint)!bVar9 * auVar37._4_4_;
      bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar9 * auVar36._8_4_ | (uint)!bVar9 * auVar37._8_4_;
      bVar9 = SUB81(uVar35 >> 3,0);
      auVar40._12_4_ = (uint)bVar9 * auVar36._12_4_ | (uint)!bVar9 * auVar37._12_4_;
      auVar36 = vphaddd_avx(auVar40,auVar40);
      auVar36 = vphaddd_avx(auVar36,auVar36);
      vcvtdq2pd_avx(auVar36);
    }
    *(undefined8 *)(puVar31 + -0x58) = 0x10815d;
    printf("After average l second half: %lf\n");
    ppbVar12 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (auVar29 = auStack_78; auVar29 != (undefined1  [8])ppbVar12;
        auVar29 = (undefined1  [8])((long)auVar29 + 8)) {
      uVar5 = *(undefined8 *)
               (*(long *)*(basic_ostream<char,_std::char_traits<char>_> **)auVar29 + -0x18);
      cVar11 = (char)*(basic_ostream<char,_std::char_traits<char>_> **)auVar29;
      *(undefined8 *)(puVar31 + -0x58) = 0x108181;
      std::ios::widen((char)uVar5 + cVar11);
      *(undefined8 *)(puVar31 + -0x58) = 0x10818c;
      std::ostream::put(cVar11);
      *(undefined8 *)(puVar31 + -0x58) = 0x108194;
      std::ostream::flush();
    }
    local_350._M_h = local_108;
    *(undefined8 *)((long)&local_350._M_h + *(long *)(local_108 + -0x18)) = local_100;
    *(undefined8 *)(puVar31 + -0x58) = 0x1081c7;
    std::filebuf::~filebuf((filebuf *)&out);
    *(undefined8 *)(puVar31 + -0x58) = 0x1081d3;
    std::ios_base::~ios_base(local_258);
    puVar31 = local_118;
    *(undefined8 *)(local_118 + -8) = 0x1081e6;
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_b8);
    psVar1 = local_f0;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 5);
  if (local_f0 != &file._M_string_length) {
    *(undefined8 *)(puVar31 + -8) = 0x108219;
    operator_delete(psVar1,file._M_string_length + 1);
  }
  auVar29 = auStack_78;
  if (auStack_78 != (undefined1  [8])0x0) {
    uVar30 = (long)outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78;
    *(undefined8 *)(puVar31 + -8) = 0x10822e;
    operator_delete((void *)auVar29,uVar30);
  }
  return;
}

Assistant:

void HeavyChange_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(3);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 8 * HeavyChange_BLOCK + 2 * HeavyChange_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 10;
		auto mp = HashMap<DATA_LEN>();
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[1] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[2] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[3] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[4] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[5] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[6] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[7] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[8] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[9] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM / 2; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		int record_count;
		auto records =
			read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &record_count);
		Data<DATA_LEN> packet;
		int t;
		int num = 0;
		int slot_packets = std::min(record_count / 2, MAX_PACKET);
		while (num < slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = 1;
			else
				mp[packet] += 1;
			num++;

			for (int j = 0; j < SKETCH_NUM / 2; ++j) {
				sketch[j]->Init(packet);
			}
		}

		while (num < 2 * slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = -1;
			else
				mp[packet] -= 1;
			num++;

			for (int j = SKETCH_NUM / 2; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet);
			}
		}

		free(records);

		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			sketch[j]->Check(mp, sketch[j + (SKETCH_NUM / 2)], outs);
		}

		ofstream out;
		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		printf("After average l first half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		printf("After average l second half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}